

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O2

string * bech32::stripUnknownChars(string *__return_storage_ptr__,string *bstring)

{
  _Iter_pred<bech32::stripUnknownChars(std::__cxx11::string_const&)::__0> *p_Var1;
  bool bVar2;
  long lVar3;
  _Iter_pred<bech32::stripUnknownChars(std::__cxx11::string_const&)::__0> *p_Var4;
  size_type sVar5;
  _Iter_pred<bech32::stripUnknownChars(std::__cxx11::string_const&)::__0> *p_Var6;
  _Iter_pred<bech32::stripUnknownChars(std::__cxx11::string_const&)::__0> *p_Var7;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)bstring);
  p_Var7 = (_Iter_pred<bech32::stripUnknownChars(std::__cxx11::string_const&)::__0> *)
           (__return_storage_ptr__->_M_dataplus)._M_p;
  sVar5 = __return_storage_ptr__->_M_string_length;
  p_Var1 = p_Var7 + sVar5;
  for (lVar3 = (long)sVar5 >> 2; p_Var4 = p_Var7, p_Var6 = p_Var1, 0 < lVar3; lVar3 = lVar3 + -1) {
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<bech32::stripUnknownChars(std::__cxx11::string_const&)::$_0>::operator()
                      (p_Var7,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               )bstring);
    if (bVar2) goto LAB_00103c2c;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<bech32::stripUnknownChars(std::__cxx11::string_const&)::$_0>::operator()
                      (p_Var7 + 1,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )bstring);
    p_Var4 = p_Var7 + 1;
    if (bVar2) goto LAB_00103c2c;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<bech32::stripUnknownChars(std::__cxx11::string_const&)::$_0>::operator()
                      (p_Var7 + 2,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )bstring);
    p_Var4 = p_Var7 + 2;
    if (bVar2) goto LAB_00103c2c;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<bech32::stripUnknownChars(std::__cxx11::string_const&)::$_0>::operator()
                      (p_Var7 + 3,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )bstring);
    p_Var4 = p_Var7 + 3;
    if (bVar2) goto LAB_00103c2c;
    p_Var7 = p_Var7 + 4;
    sVar5 = sVar5 - 4;
  }
  if (sVar5 == 1) {
LAB_00103c1b:
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<bech32::stripUnknownChars(std::__cxx11::string_const&)::$_0>::operator()
                      (p_Var7,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               )bstring);
    p_Var4 = p_Var7;
    if (!bVar2) {
      p_Var4 = p_Var1;
    }
  }
  else if (sVar5 == 2) {
LAB_00103c0c:
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<bech32::stripUnknownChars(std::__cxx11::string_const&)::$_0>::operator()
                      (p_Var7,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               )bstring);
    p_Var4 = p_Var7;
    if (!bVar2) {
      p_Var7 = p_Var7 + 1;
      goto LAB_00103c1b;
    }
  }
  else {
    if (sVar5 != 3) goto LAB_00103c57;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<bech32::stripUnknownChars(std::__cxx11::string_const&)::$_0>::operator()
                      (p_Var7,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               )bstring);
    if (!bVar2) {
      p_Var7 = p_Var7 + 1;
      goto LAB_00103c0c;
    }
  }
LAB_00103c2c:
  p_Var7 = p_Var4;
  if (p_Var4 != p_Var1) {
    while (p_Var6 = p_Var7, p_Var4 = p_Var4 + 1, p_Var4 != p_Var1) {
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<bech32::stripUnknownChars(std::__cxx11::string_const&)::$_0>::operator()
                        (p_Var4,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )bstring);
      p_Var7 = p_Var6;
      if (!bVar2) {
        *p_Var6 = *p_Var4;
        p_Var7 = p_Var6 + 1;
      }
    }
  }
LAB_00103c57:
  std::__cxx11::string::erase
            (__return_storage_ptr__,p_Var6,
             (__return_storage_ptr__->_M_dataplus)._M_p + __return_storage_ptr__->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string stripUnknownChars(const std::string &bstring) {
        std::string ret(bstring);
        ret.erase(
                std::remove_if(
                        ret.begin(), ret.end(),
                        [](char x){return (!isAllowedChar(static_cast<char>(::tolower(x))) && x!=separator);}),
                ret.end());
        return ret;
    }